

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputImpl.cpp
# Opt level: O0

Vector2i sf::priv::InputImpl::getMousePosition(void)

{
  int gy;
  int gx;
  uint buttons;
  int y;
  int x;
  Window child;
  Window root;
  Display *display;
  Display *in_stack_ffffffffffffffc0;
  int local_34;
  int local_30;
  undefined1 local_2c [4];
  undefined1 local_28 [4];
  undefined1 local_24 [4];
  undefined1 local_20 [8];
  undefined1 local_18 [8];
  Display *local_10;
  Vector2i local_8;
  
  local_10 = OpenDisplay();
  local_30 = 0;
  local_34 = 0;
  XQueryPointer(local_10,*(undefined8 *)
                          (*(long *)(local_10 + 0xe8) + (long)*(int *)(local_10 + 0xe0) * 0x80 +
                          0x10),local_18,local_20,&local_30,&local_34,local_24,local_28,local_2c);
  CloseDisplay(in_stack_ffffffffffffffc0);
  Vector2<int>::Vector2(&local_8,local_30,local_34);
  return local_8;
}

Assistant:

Vector2i InputImpl::getMousePosition()
{
    // Open a connection with the X server
    Display* display = OpenDisplay();

    // we don't care about these but they are required
    ::Window root, child;
    int x, y;
    unsigned int buttons;

    int gx = 0;
    int gy = 0;
    XQueryPointer(display, DefaultRootWindow(display), &root, &child, &gx, &gy, &x, &y, &buttons);

    // Close the connection with the X server
    CloseDisplay(display);

    return Vector2i(gx, gy);
}